

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::Table
          (Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_> *this
          )

{
  DataNode<robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_true>
  *pDVar1;
  undefined8 *in_RDI;
  
  *in_RDI = 0xc4ceb9fe1a85ec53;
  pDVar1 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>::DataNode<robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,true>*>
                     (in_RDI + 4);
  in_RDI[1] = pDVar1;
  in_RDI[2] = in_RDI + 4;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0x20;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  return;
}

Assistant:

Table() noexcept(noexcept(Hash()) && noexcept(KeyEqual()))
        : WHash()
        , WKeyEqual() {
        ROBIN_HOOD_TRACE(this)
    }